

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_blockwise_nl_join.cpp
# Opt level: O2

void __thiscall duckdb::BlockwiseNLJoinState::~BlockwiseNLJoinState(BlockwiseNLJoinState *this)

{
  (this->super_CachingOperatorState).super_OperatorState._vptr_OperatorState =
       (_func_int **)&PTR__BlockwiseNLJoinState_017a24d8;
  DataChunk::~DataChunk(&this->intermediate_chunk);
  ExpressionExecutor::~ExpressionExecutor(&this->executor);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->match_sel).selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
            (&(this->left_outer).found_match.super_unique_ptr<bool[],_std::default_delete<bool[]>_>)
  ;
  CrossProductExecutor::~CrossProductExecutor(&this->cross_product);
  CachingOperatorState::~CachingOperatorState(&this->super_CachingOperatorState);
  return;
}

Assistant:

explicit BlockwiseNLJoinState(ExecutionContext &context, ColumnDataCollection &rhs,
	                              const PhysicalBlockwiseNLJoin &op)
	    : op(op), cross_product(rhs), left_outer(IsLeftOuterJoin(op.join_type)), match_sel(STANDARD_VECTOR_SIZE),
	      executor(context.client, *op.condition) {
		left_outer.Initialize(STANDARD_VECTOR_SIZE);
		ResetMatches();
	}